

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Totals * __thiscall
Catch::RunContext::runTest(Totals *__return_storage_ptr__,RunContext *this,TestCase *testCase)

{
  Option<Catch::SectionTracking::TestCaseTracker> *this_00;
  IStreamingReporter *pIVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  IMutableContext *pIVar6;
  string redirectedCerr;
  string redirectedCout;
  Totals prevTotals;
  TestCaseInfo testInfo;
  string local_2c8;
  string local_2a8;
  Totals local_288;
  TestCaseInfo local_260;
  TestCaseStats local_180;
  
  local_288.assertions.passed = (this->m_totals).assertions.passed;
  local_288.assertions.failed = (this->m_totals).assertions.failed;
  local_288.testCases.passed = (this->m_totals).testCases.passed;
  local_288.testCases.failed = (this->m_totals).testCases.failed;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  local_2c8._M_string_length = 0;
  local_2c8.field_2._M_local_buf[0] = '\0';
  TestCaseInfo::TestCaseInfo(&local_260,&testCase->super_TestCaseInfo);
  pIVar1 = (this->m_reporter).m_p;
  (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[8])(pIVar1,&local_260);
  this->m_activeTestCase = testCase;
  SectionTracking::TestCaseTracker::TestCaseTracker((TestCaseTracker *)&local_180,&local_260.name);
  this_00 = &this->m_testCaseTracker;
  Option<Catch::SectionTracking::TestCaseTracker>::operator=(this_00,(TestCaseTracker *)&local_180);
  SectionTracking::TrackedSection::~TrackedSection((TrackedSection *)&local_180);
LAB_00145685:
  do {
    runCurrentTest(this,&local_2a8,&local_2c8);
    if ((this_00->nullableValue->m_testCase).m_runState != Completed) {
      bVar4 = aborting(this);
      if (!bVar4) goto LAB_00145685;
    }
    pIVar6 = getCurrentMutableContext();
    iVar5 = (*(pIVar6->super_IContext)._vptr_IContext[5])(pIVar6);
    if ((char)iVar5 == '\0') goto LAB_001456c6;
    bVar4 = aborting(this);
    if (bVar4) {
LAB_001456c6:
      Totals::delta(__return_storage_ptr__,&this->m_totals,&local_288);
      sVar2 = (__return_storage_ptr__->testCases).failed;
      sVar3 = (this->m_totals).testCases.failed;
      (this->m_totals).testCases.passed =
           (this->m_totals).testCases.passed + (__return_storage_ptr__->testCases).passed;
      (this->m_totals).testCases.failed = sVar3 + sVar2;
      pIVar1 = (this->m_reporter).m_p;
      bVar4 = aborting(this);
      TestCaseStats::TestCaseStats
                (&local_180,&local_260,__return_storage_ptr__,&local_2a8,&local_2c8,bVar4);
      (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar1,&local_180);
      TestCaseStats::~TestCaseStats(&local_180);
      this->m_activeTestCase = (TestCase *)0x0;
      Option<Catch::SectionTracking::TestCaseTracker>::reset(this_00);
      TestCaseInfo::~TestCaseInfo(&local_260);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)&local_2a8);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Totals runTest( TestCase const& testCase ) {
            Totals prevTotals = m_totals;

            std::string redirectedCout;
            std::string redirectedCerr;

            TestCaseInfo testInfo = testCase.getTestCaseInfo();

            m_reporter->testCaseStarting( testInfo );

            m_activeTestCase = &testCase;
            m_testCaseTracker = TestCaseTracker( testInfo.name );

            do {
                do {
                    runCurrentTest( redirectedCout, redirectedCerr );
                }
                while( !m_testCaseTracker->isCompleted() && !aborting() );
            }
            while( getCurrentContext().advanceGeneratorsForCurrentTest() && !aborting() );

            Totals deltaTotals = m_totals.delta( prevTotals );
            m_totals.testCases += deltaTotals.testCases;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        redirectedCout,
                                                        redirectedCerr,
                                                        aborting() ) );

            m_activeTestCase = NULL;
            m_testCaseTracker.reset();

            return deltaTotals;
        }